

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O1

CgreenVector * create_vector_of_double_markers_for(char *parameters)

{
  char *pcVar1;
  int iVar2;
  CgreenVector *vector;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  void *item;
  char *__s_00;
  int local_38;
  
  vector = create_cgreen_vector(free);
  if ((parameters != (char *)0x0) && (*parameters != '\0')) {
    __s = stringdup(parameters);
    if (__s != (char *)0x0) {
      sVar3 = strlen(__s);
      tokenise_by_commas_and_whitespace(__s);
      sVar4 = strlen(parameters);
      if (0 < (long)sVar4) {
        pcVar1 = __s;
LAB_0010bb69:
        do {
          __s_00 = pcVar1;
          if (__s_00 < __s + sVar3) {
            pcVar1 = __s_00 + 1;
            if (*__s_00 == '\0') goto LAB_0010bb69;
          }
          sVar4 = strlen(__s_00);
          iVar2 = strncmp("box_double",__s_00,10);
          item = malloc(1);
          *(bool *)item = iVar2 == 0;
          cgreen_vector_add(vector,item);
          strip_function_from(__s_00,"box_double");
          strip_function_from(__s_00,"d");
          local_38 = (int)sVar4;
          sVar4 = strlen(parameters);
          pcVar1 = __s_00 + local_38;
        } while (__s_00 + local_38 < __s + sVar4);
      }
      free(__s);
    }
  }
  return vector;
}

Assistant:

CgreenVector *create_vector_of_double_markers_for(const char *parameters) {
    char *parameters_to_tokenize;
    char *parameters_end;
    char *tokens;
    char *token;
    CgreenVector *markers = create_cgreen_vector(&free);
    if ((parameters == NULL) || (strlen(parameters) == 0)) {
        return markers;
    }

    parameters_to_tokenize = stringdup(parameters);
    if (parameters_to_tokenize == NULL) {
        return markers;
    }

    parameters_end = parameters_to_tokenize + strlen(parameters_to_tokenize);
    tokens = tokenise_by_commas_and_whitespace(parameters_to_tokenize);
    token = tokens;
    while (token < tokens + strlen(parameters)) {
        token = skip_nulls_until(token, parameters_end);
        int length_of_token = strlen(token);
        if (begins_with(token, "box_double"))
            cgreen_vector_add(markers, pointer_to_bool(true));
        else
            cgreen_vector_add(markers, pointer_to_bool(false));
        token = strip_function_from(token, "box_double");
        token = strip_function_from(token, "d");
        token += length_of_token;
    }

    free(tokens);
    return markers;
}